

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::UserGeometry> *recalculatePrimRef)

{
  BBox1f BVar1;
  float fVar2;
  Geometry *pGVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001208 [56];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar34;
  undefined1 auVar33 [64];
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar39;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 in_register_000014c4 [12];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> blower1;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower0;
  undefined8 local_188;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  void *local_138;
  float fStack_130;
  int iStack_12c;
  undefined8 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  size_t local_f8;
  PrimRefMB *local_f0;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  void *local_c0;
  float local_b8;
  int local_b4;
  void **local_b0;
  PrimRefMB *local_a8;
  size_t local_a0;
  TemporalBinInfo *local_98;
  RecalculatePrimRef<embree::UserGeometry> *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar30._8_56_ = in_register_00001208;
  auVar30._0_8_ = time_range;
  local_48 = auVar30._0_16_;
  auVar30 = ZEXT1664(local_48);
  local_58 = vmovshdup_avx(local_48);
  auVar33 = ZEXT1664(local_58);
  fVar34 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar14 = (set->super_PrimInfoMB).max_time_range.upper - fVar34;
  fVar15 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar22 = (((time_range.lower * 0.5 + local_58._0_4_ * 0.5) - fVar34) / fVar14) * fVar15;
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar18 = vandps_avx(ZEXT416((uint)fVar22),auVar18);
  auVar24._8_4_ = 0x3effffff;
  auVar24._0_8_ = 0x3effffff3effffff;
  auVar24._12_4_ = 0x3effffff;
  auVar18 = vorps_avx(auVar18,auVar24);
  auVar18 = ZEXT416((uint)(fVar22 + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  fVar34 = (auVar18._0_4_ / fVar15) * fVar14 + fVar34;
  auVar18 = vcmpps_avx(local_58,ZEXT416((uint)fVar34),6);
  auVar24 = vcmpps_avx(ZEXT416((uint)fVar34),local_48,6);
  auVar18 = vandps_avx(auVar24,auVar18);
  if (begin < end && (~auVar18[0] & 1) == 0) {
    auVar27 = ZEXT864(0);
    local_68 = ZEXT416((uint)fVar34);
    local_a8 = prims;
    local_a0 = end;
    local_98 = this;
    local_90 = recalculatePrimRef;
    do {
      local_f0 = prims + begin;
      if ((auVar30._0_4_ < prims[begin].time_range.upper * 0.9999) &&
         ((local_f0->time_range).lower * 1.0001 < fVar34)) {
        pGVar3 = (local_90->scene->geometries).items
                 [(uint)(local_f0->lbounds).bounds0.lower.field_0.m128[3]].ptr;
        fVar22 = pGVar3->fnumTimeSegments;
        fVar14 = (pGVar3->time_range).lower;
        fVar15 = (pGVar3->time_range).upper - fVar14;
        fVar21 = (auVar30._0_4_ - fVar14) / fVar15;
        fVar15 = (fVar34 - fVar14) / fVar15;
        fVar34 = fVar22 * fVar21;
        local_168._0_4_ = fVar15;
        fVar15 = fVar22 * fVar15;
        auVar28 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
        auVar31 = vroundss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),10);
        auVar18 = vmaxss_avx(auVar28,auVar27._0_16_);
        local_148._0_4_ = auVar18._0_4_;
        auVar24 = vminss_avx(auVar31,ZEXT416((uint)fVar22));
        fVar14 = (float)(int)auVar18._0_4_;
        fVar26 = auVar24._0_4_;
        iVar13 = (int)auVar28._0_4_;
        if ((int)auVar28._0_4_ < 0) {
          iVar13 = -1;
        }
        fVar2 = (local_f0->lbounds).bounds0.upper.field_0.m128[3];
        iVar8 = (int)fVar22 + 1;
        if ((int)auVar31._0_4_ < (int)fVar22 + 1) {
          iVar8 = (int)auVar31._0_4_;
        }
        local_188 = pGVar3->userPtr;
        local_178 = &local_88;
        fStack_180 = fVar2;
        fStack_17c = fVar14;
        local_f8 = begin;
        (**(code **)&pGVar3->field_0x58)(&local_188);
        local_118 = pGVar3->userPtr;
        local_158._0_4_ = (int)fVar26;
        local_108 = &local_188;
        fStack_110 = fVar2;
        fStack_10c = (float)(int)fVar26;
        (**(code **)&pGVar3->field_0x58)(&local_118);
        fVar34 = fVar34 - (float)local_148._0_4_;
        if (iVar8 - iVar13 == 1) {
          auVar18 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar31._0_4_ = auVar24._0_4_ * (float)local_188 + auVar18._0_4_ * local_88;
          auVar31._4_4_ = auVar24._4_4_ * local_188._4_4_ + auVar18._4_4_ * fStack_84;
          auVar31._8_4_ = auVar24._8_4_ * fStack_180 + auVar18._8_4_ * fStack_80;
          auVar31._12_4_ = auVar24._12_4_ * fStack_17c + auVar18._12_4_ * fStack_7c;
          auVar40._0_4_ = auVar24._0_4_ * (float)local_178 + auVar18._0_4_ * local_78;
          auVar40._4_4_ = auVar24._4_4_ * local_178._4_4_ + auVar18._4_4_ * fStack_74;
          auVar40._8_4_ = auVar24._8_4_ * fStack_170 + auVar18._8_4_ * fStack_70;
          auVar40._12_4_ = auVar24._12_4_ * fStack_16c + auVar18._12_4_ * fStack_6c;
          auVar18 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar15)),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar35._0_4_ = auVar18._0_4_ * (float)local_188 + auVar24._0_4_ * local_88;
          auVar35._4_4_ = auVar18._4_4_ * local_188._4_4_ + auVar24._4_4_ * fStack_84;
          auVar35._8_4_ = auVar18._8_4_ * fStack_180 + auVar24._8_4_ * fStack_80;
          auVar35._12_4_ = auVar18._12_4_ * fStack_17c + auVar24._12_4_ * fStack_7c;
          auVar28._0_4_ = auVar18._0_4_ * (float)local_178 + auVar24._0_4_ * local_78;
          auVar28._4_4_ = auVar18._4_4_ * local_178._4_4_ + auVar24._4_4_ * fStack_74;
          auVar28._8_4_ = auVar18._8_4_ * fStack_170 + auVar24._8_4_ * fStack_70;
          auVar28._12_4_ = auVar18._12_4_ * fStack_16c + auVar24._12_4_ * fStack_6c;
          auVar18 = ZEXT816(0);
          begin = local_f8;
        }
        else {
          fStack_dc = (float)((int)fVar14 + 1);
          local_e8 = pGVar3->userPtr;
          local_d8 = &local_118;
          fStack_e0 = fVar2;
          (**(code **)&pGVar3->field_0x58)(&local_e8);
          iStack_12c = local_158._0_4_ + -1;
          local_138 = pGVar3->userPtr;
          fStack_130 = fVar2;
          local_128 = &local_e8;
          (**(code **)&pGVar3->field_0x58)(&local_138);
          begin = local_f8;
          auVar18 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar31._0_4_ = auVar24._0_4_ * (float)local_118 + auVar18._0_4_ * local_88;
          auVar31._4_4_ = auVar24._4_4_ * local_118._4_4_ + auVar18._4_4_ * fStack_84;
          auVar31._8_4_ = auVar24._8_4_ * fStack_110 + auVar18._8_4_ * fStack_80;
          auVar31._12_4_ = auVar24._12_4_ * fStack_10c + auVar18._12_4_ * fStack_7c;
          auVar40._0_4_ = auVar24._0_4_ * (float)local_108 + auVar18._0_4_ * local_78;
          auVar40._4_4_ = auVar24._4_4_ * local_108._4_4_ + auVar18._4_4_ * fStack_74;
          auVar40._8_4_ = auVar24._8_4_ * fStack_100 + auVar18._8_4_ * fStack_70;
          auVar40._12_4_ = auVar24._12_4_ * fStack_fc + auVar18._12_4_ * fStack_6c;
          auVar18 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar15)),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar35._0_4_ = auVar24._0_4_ * (float)local_e8 + auVar18._0_4_ * (float)local_188;
          auVar35._4_4_ = auVar24._4_4_ * local_e8._4_4_ + auVar18._4_4_ * local_188._4_4_;
          auVar35._8_4_ = auVar24._8_4_ * fStack_e0 + auVar18._8_4_ * fStack_180;
          auVar35._12_4_ = auVar24._12_4_ * fStack_dc + auVar18._12_4_ * fStack_17c;
          auVar28._0_4_ = auVar24._0_4_ * (float)local_d8 + auVar18._0_4_ * (float)local_178;
          auVar28._4_4_ = auVar24._4_4_ * local_d8._4_4_ + auVar18._4_4_ * local_178._4_4_;
          auVar28._8_4_ = auVar24._8_4_ * fStack_d0 + auVar18._8_4_ * fStack_170;
          auVar28._12_4_ = auVar24._12_4_ * fStack_cc + auVar18._12_4_ * fStack_16c;
          iVar13 = iVar13 + 1;
          if (iVar13 < iVar8) {
            fVar34 = (float)local_168._0_4_ - fVar21;
            do {
              auVar16._0_4_ = ((float)iVar13 / fVar22 - fVar21) / fVar34;
              auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar18 = vshufps_avx(auVar16,auVar16,0);
              fVar37 = auVar35._4_4_;
              fVar38 = auVar35._8_4_;
              fVar39 = auVar35._12_4_;
              auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar16._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar16._0_4_)),0);
              fVar14 = auVar31._4_4_;
              fVar15 = auVar31._8_4_;
              fVar26 = auVar31._12_4_;
              local_158._0_4_ = auVar35._0_4_ * auVar18._0_4_ + auVar31._0_4_ * auVar24._0_4_;
              local_158._4_4_ = fVar37 * auVar18._4_4_ + fVar14 * auVar24._4_4_;
              local_158._8_4_ = fVar38 * auVar18._8_4_ + fVar15 * auVar24._8_4_;
              local_158._12_4_ = fVar39 * auVar18._12_4_ + fVar26 * auVar24._12_4_;
              fVar42 = auVar40._4_4_;
              fVar43 = auVar40._8_4_;
              fVar44 = auVar40._12_4_;
              local_168._0_4_ = auVar28._0_4_ * auVar18._0_4_ + auVar40._0_4_ * auVar24._0_4_;
              local_168._4_4_ = auVar28._4_4_ * auVar18._4_4_ + fVar42 * auVar24._4_4_;
              local_168._8_4_ = auVar28._8_4_ * auVar18._8_4_ + fVar43 * auVar24._8_4_;
              local_168._12_4_ = auVar28._12_4_ * auVar18._12_4_ + fVar44 * auVar24._12_4_;
              local_c0 = pGVar3->userPtr;
              _local_148 = auVar28;
              local_b8 = fVar2;
              local_b4 = iVar13;
              local_b0 = &local_138;
              (**(code **)&pGVar3->field_0x58)(&local_c0);
              auVar9._8_4_ = fStack_130;
              auVar9._0_8_ = local_138;
              auVar9._12_4_ = iStack_12c;
              auVar18 = vsubps_avx(auVar9,local_158);
              auVar11._8_8_ = uStack_120;
              auVar11._0_8_ = local_128;
              auVar28 = vsubps_avx(auVar11,local_168);
              auVar24 = vminps_avx(auVar18,ZEXT816(0) << 0x40);
              auVar18 = vmaxps_avx(auVar28,ZEXT816(0) << 0x40);
              auVar31._0_4_ = auVar31._0_4_ + auVar24._0_4_;
              auVar31._4_4_ = fVar14 + auVar24._4_4_;
              auVar31._8_4_ = fVar15 + auVar24._8_4_;
              auVar31._12_4_ = fVar26 + auVar24._12_4_;
              auVar35._0_4_ = auVar35._0_4_ + auVar24._0_4_;
              auVar35._4_4_ = fVar37 + auVar24._4_4_;
              auVar35._8_4_ = fVar38 + auVar24._8_4_;
              auVar35._12_4_ = fVar39 + auVar24._12_4_;
              auVar40._0_4_ = auVar40._0_4_ + auVar18._0_4_;
              auVar40._4_4_ = fVar42 + auVar18._4_4_;
              auVar40._8_4_ = fVar43 + auVar18._8_4_;
              auVar40._12_4_ = fVar44 + auVar18._12_4_;
              auVar28._0_4_ = (float)local_148._0_4_ + auVar18._0_4_;
              auVar28._4_4_ = (float)local_148._4_4_ + auVar18._4_4_;
              auVar28._8_4_ = fStack_140 + auVar18._8_4_;
              auVar28._12_4_ = fStack_13c + auVar18._12_4_;
              iVar13 = iVar13 + 1;
            } while (iVar8 != iVar13);
          }
          auVar18 = ZEXT816(0) << 0x20;
        }
        auVar27 = ZEXT1664(auVar18 << 0x20);
        aVar6.m128 = (__m128)vminps_avx(local_98->bounds0[0].bounds0.lower.field_0,auVar31);
        aVar4.m128 = (__m128)vmaxps_avx(local_98->bounds0[0].bounds0.upper.field_0,auVar40);
        aVar7.m128 = (__m128)vminps_avx(local_98->bounds0[0].bounds1.lower.field_0,auVar35);
        aVar5.m128 = (__m128)vmaxps_avx(local_98->bounds0[0].bounds1.upper.field_0,auVar28);
        local_98->bounds0[0].bounds0.lower.field_0 = aVar6;
        local_98->bounds0[0].bounds0.upper.field_0 = aVar4;
        local_98->bounds0[0].bounds1.lower.field_0 = aVar7;
        local_98->bounds0[0].bounds1.upper.field_0 = aVar5;
        auVar17._0_4_ = (float)(uint)(local_f0->lbounds).bounds1.upper.field_0.m128[3];
        auVar17._4_12_ = in_register_000014c4;
        BVar1 = local_f0->time_range;
        auVar23._8_8_ = 0;
        auVar23._0_4_ = BVar1.lower;
        auVar23._4_4_ = BVar1.upper;
        auVar24 = vmovshdup_avx(auVar23);
        fVar22 = BVar1.lower;
        fVar34 = auVar24._0_4_ - fVar22;
        auVar30 = ZEXT1664(local_48);
        auVar24 = ZEXT416((uint)(((local_48._0_4_ - fVar22) / fVar34) * 1.0000002 * auVar17._0_4_));
        auVar24 = vroundss_avx(auVar24,auVar24,9);
        auVar18 = vmaxss_avx(auVar18 << 0x20,auVar24);
        auVar24 = ZEXT416((uint)((((float)local_68._0_4_ - fVar22) / fVar34) * 0.99999976 *
                                auVar17._0_4_));
        auVar24 = vroundss_avx(auVar24,auVar24,10);
        auVar24 = vminss_avx(auVar24,auVar17);
        local_98->count0[0] = local_98->count0[0] + (long)((int)auVar24._0_4_ - (int)auVar18._0_4_);
        auVar33 = ZEXT1664(local_58);
        end = local_a0;
        prims = local_a8;
        fVar34 = (float)local_68._0_4_;
      }
      if ((fVar34 < (local_f0->time_range).upper * 0.9999) &&
         ((local_f0->time_range).lower * 1.0001 < auVar33._0_4_)) {
        pGVar3 = (local_90->scene->geometries).items
                 [(uint)(local_f0->lbounds).bounds0.lower.field_0.m128[3]].ptr;
        fVar22 = pGVar3->fnumTimeSegments;
        fVar14 = (pGVar3->time_range).lower;
        fVar15 = (pGVar3->time_range).upper - fVar14;
        fVar21 = (fVar34 - fVar14) / fVar15;
        fVar15 = (auVar33._0_4_ - fVar14) / fVar15;
        fVar34 = fVar22 * fVar21;
        fVar14 = fVar22 * fVar15;
        auVar28 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
        auVar31 = vroundss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),10);
        auVar18 = vmaxss_avx(auVar28,auVar27._0_16_);
        local_148._0_4_ = auVar18._0_4_;
        auVar24 = vminss_avx(auVar31,ZEXT416((uint)fVar22));
        fStack_17c = (float)(int)auVar18._0_4_;
        fVar26 = auVar24._0_4_;
        iVar13 = (int)auVar28._0_4_;
        if ((int)auVar28._0_4_ < 0) {
          iVar13 = -1;
        }
        fVar2 = (local_f0->lbounds).bounds0.upper.field_0.m128[3];
        iVar8 = (int)fVar22 + 1;
        if ((int)auVar31._0_4_ < (int)fVar22 + 1) {
          iVar8 = (int)auVar31._0_4_;
        }
        local_188 = pGVar3->userPtr;
        local_168._0_4_ = fStack_17c;
        local_178 = &local_88;
        fStack_180 = fVar2;
        (**(code **)&pGVar3->field_0x58)(&local_188);
        local_118 = pGVar3->userPtr;
        local_158._0_4_ = (int)fVar26;
        local_108 = &local_188;
        fStack_110 = fVar2;
        fStack_10c = (float)(int)fVar26;
        (**(code **)&pGVar3->field_0x58)(&local_118);
        fVar34 = fVar34 - (float)local_148._0_4_;
        if (iVar8 - iVar13 == 1) {
          auVar18 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar32._0_4_ = auVar24._0_4_ * (float)local_188 + auVar18._0_4_ * local_88;
          auVar32._4_4_ = auVar24._4_4_ * local_188._4_4_ + auVar18._4_4_ * fStack_84;
          auVar32._8_4_ = auVar24._8_4_ * fStack_180 + auVar18._8_4_ * fStack_80;
          auVar32._12_4_ = auVar24._12_4_ * fStack_17c + auVar18._12_4_ * fStack_7c;
          auVar41._0_4_ = auVar24._0_4_ * (float)local_178 + auVar18._0_4_ * local_78;
          auVar41._4_4_ = auVar24._4_4_ * local_178._4_4_ + auVar18._4_4_ * fStack_74;
          auVar41._8_4_ = auVar24._8_4_ * fStack_170 + auVar18._8_4_ * fStack_70;
          auVar41._12_4_ = auVar24._12_4_ * fStack_16c + auVar18._12_4_ * fStack_6c;
          auVar18 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar14)),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar36._0_4_ = auVar18._0_4_ * (float)local_188 + auVar24._0_4_ * local_88;
          auVar36._4_4_ = auVar18._4_4_ * local_188._4_4_ + auVar24._4_4_ * fStack_84;
          auVar36._8_4_ = auVar18._8_4_ * fStack_180 + auVar24._8_4_ * fStack_80;
          auVar36._12_4_ = auVar18._12_4_ * fStack_17c + auVar24._12_4_ * fStack_7c;
          auVar29._0_4_ = auVar18._0_4_ * (float)local_178 + auVar24._0_4_ * local_78;
          auVar29._4_4_ = auVar18._4_4_ * local_178._4_4_ + auVar24._4_4_ * fStack_74;
          auVar29._8_4_ = auVar18._8_4_ * fStack_170 + auVar24._8_4_ * fStack_70;
          auVar29._12_4_ = auVar18._12_4_ * fStack_16c + auVar24._12_4_ * fStack_6c;
        }
        else {
          fStack_dc = (float)(local_168._0_4_ + 1);
          local_e8 = pGVar3->userPtr;
          local_d8 = &local_118;
          fStack_e0 = fVar2;
          (**(code **)&pGVar3->field_0x58)(&local_e8);
          iStack_12c = local_158._0_4_ + -1;
          local_138 = pGVar3->userPtr;
          fStack_130 = fVar2;
          local_128 = &local_e8;
          (**(code **)&pGVar3->field_0x58)(&local_138);
          auVar18 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar32._0_4_ = auVar24._0_4_ * (float)local_118 + auVar18._0_4_ * local_88;
          auVar32._4_4_ = auVar24._4_4_ * local_118._4_4_ + auVar18._4_4_ * fStack_84;
          auVar32._8_4_ = auVar24._8_4_ * fStack_110 + auVar18._8_4_ * fStack_80;
          auVar32._12_4_ = auVar24._12_4_ * fStack_10c + auVar18._12_4_ * fStack_7c;
          auVar41._0_4_ = auVar24._0_4_ * (float)local_108 + auVar18._0_4_ * local_78;
          auVar41._4_4_ = auVar24._4_4_ * local_108._4_4_ + auVar18._4_4_ * fStack_74;
          auVar41._8_4_ = auVar24._8_4_ * fStack_100 + auVar18._8_4_ * fStack_70;
          auVar41._12_4_ = auVar24._12_4_ * fStack_fc + auVar18._12_4_ * fStack_6c;
          auVar18 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar14)),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar18,auVar18,0);
          auVar18 = ZEXT416((uint)(1.0 - auVar18._0_4_));
          auVar18 = vshufps_avx(auVar18,auVar18,0);
          auVar36._0_4_ = auVar24._0_4_ * (float)local_e8 + auVar18._0_4_ * (float)local_188;
          auVar36._4_4_ = auVar24._4_4_ * local_e8._4_4_ + auVar18._4_4_ * local_188._4_4_;
          auVar36._8_4_ = auVar24._8_4_ * fStack_e0 + auVar18._8_4_ * fStack_180;
          auVar36._12_4_ = auVar24._12_4_ * fStack_dc + auVar18._12_4_ * fStack_17c;
          auVar29._0_4_ = auVar24._0_4_ * (float)local_d8 + auVar18._0_4_ * (float)local_178;
          auVar29._4_4_ = auVar24._4_4_ * local_d8._4_4_ + auVar18._4_4_ * local_178._4_4_;
          auVar29._8_4_ = auVar24._8_4_ * fStack_d0 + auVar18._8_4_ * fStack_170;
          auVar29._12_4_ = auVar24._12_4_ * fStack_cc + auVar18._12_4_ * fStack_16c;
          iVar13 = iVar13 + 1;
          if (iVar13 < iVar8) {
            do {
              auVar19._0_4_ = ((float)iVar13 / fVar22 - fVar21) / (fVar15 - fVar21);
              auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar18 = vshufps_avx(auVar19,auVar19,0);
              fVar37 = auVar36._4_4_;
              fVar38 = auVar36._8_4_;
              fVar39 = auVar36._12_4_;
              auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar19._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar19._0_4_)),0);
              fVar34 = auVar32._4_4_;
              fVar14 = auVar32._8_4_;
              fVar26 = auVar32._12_4_;
              local_158._0_4_ = auVar36._0_4_ * auVar18._0_4_ + auVar32._0_4_ * auVar24._0_4_;
              local_158._4_4_ = fVar37 * auVar18._4_4_ + fVar34 * auVar24._4_4_;
              local_158._8_4_ = fVar38 * auVar18._8_4_ + fVar14 * auVar24._8_4_;
              local_158._12_4_ = fVar39 * auVar18._12_4_ + fVar26 * auVar24._12_4_;
              fVar42 = auVar41._4_4_;
              fVar43 = auVar41._8_4_;
              fVar44 = auVar41._12_4_;
              local_168._0_4_ = auVar29._0_4_ * auVar18._0_4_ + auVar41._0_4_ * auVar24._0_4_;
              local_168._4_4_ = auVar29._4_4_ * auVar18._4_4_ + fVar42 * auVar24._4_4_;
              local_168._8_4_ = auVar29._8_4_ * auVar18._8_4_ + fVar43 * auVar24._8_4_;
              local_168._12_4_ = auVar29._12_4_ * auVar18._12_4_ + fVar44 * auVar24._12_4_;
              local_c0 = pGVar3->userPtr;
              _local_148 = auVar29;
              local_b8 = fVar2;
              local_b4 = iVar13;
              local_b0 = &local_138;
              (**(code **)&pGVar3->field_0x58)(&local_c0);
              auVar10._8_4_ = fStack_130;
              auVar10._0_8_ = local_138;
              auVar10._12_4_ = iStack_12c;
              auVar18 = vsubps_avx(auVar10,local_158);
              auVar12._8_8_ = uStack_120;
              auVar12._0_8_ = local_128;
              auVar28 = vsubps_avx(auVar12,local_168);
              auVar24 = vminps_avx(auVar18,ZEXT816(0) << 0x40);
              auVar18 = vmaxps_avx(auVar28,ZEXT816(0) << 0x40);
              auVar32._0_4_ = auVar32._0_4_ + auVar24._0_4_;
              auVar32._4_4_ = fVar34 + auVar24._4_4_;
              auVar32._8_4_ = fVar14 + auVar24._8_4_;
              auVar32._12_4_ = fVar26 + auVar24._12_4_;
              auVar36._0_4_ = auVar36._0_4_ + auVar24._0_4_;
              auVar36._4_4_ = fVar37 + auVar24._4_4_;
              auVar36._8_4_ = fVar38 + auVar24._8_4_;
              auVar36._12_4_ = fVar39 + auVar24._12_4_;
              auVar41._0_4_ = auVar41._0_4_ + auVar18._0_4_;
              auVar41._4_4_ = fVar42 + auVar18._4_4_;
              auVar41._8_4_ = fVar43 + auVar18._8_4_;
              auVar41._12_4_ = fVar44 + auVar18._12_4_;
              auVar29._0_4_ = (float)local_148._0_4_ + auVar18._0_4_;
              auVar29._4_4_ = (float)local_148._4_4_ + auVar18._4_4_;
              auVar29._8_4_ = fStack_140 + auVar18._8_4_;
              auVar29._12_4_ = fStack_13c + auVar18._12_4_;
              iVar13 = iVar13 + 1;
            } while (iVar8 != iVar13);
          }
        }
        auVar27 = ZEXT1664(ZEXT816(0) << 0x40);
        aVar6.m128 = (__m128)vminps_avx(local_98->bounds1[0].bounds0.lower.field_0,auVar32);
        aVar4.m128 = (__m128)vmaxps_avx(local_98->bounds1[0].bounds0.upper.field_0,auVar41);
        aVar7.m128 = (__m128)vminps_avx(local_98->bounds1[0].bounds1.lower.field_0,auVar36);
        aVar5.m128 = (__m128)vmaxps_avx(local_98->bounds1[0].bounds1.upper.field_0,auVar29);
        local_98->bounds1[0].bounds0.lower.field_0 = aVar6;
        local_98->bounds1[0].bounds0.upper.field_0 = aVar4;
        local_98->bounds1[0].bounds1.lower.field_0 = aVar7;
        local_98->bounds1[0].bounds1.upper.field_0 = aVar5;
        auVar20._0_4_ = (float)(uint)(local_f0->lbounds).bounds1.upper.field_0.m128[3];
        auVar20._4_12_ = in_register_000014c4;
        BVar1 = local_f0->time_range;
        auVar25._8_8_ = 0;
        auVar25._0_4_ = BVar1.lower;
        auVar25._4_4_ = BVar1.upper;
        fVar22 = BVar1.lower;
        auVar18 = vmovshdup_avx(auVar25);
        fVar34 = auVar18._0_4_ - fVar22;
        auVar33 = ZEXT1664(local_58);
        auVar18 = ZEXT416((uint)((((float)local_68._0_4_ - fVar22) / fVar34) * 1.0000002 *
                                auVar20._0_4_));
        auVar18 = vroundss_avx(auVar18,auVar18,9);
        auVar18 = vmaxss_avx(ZEXT816(0) << 0x40,auVar18);
        auVar24 = ZEXT416((uint)(((local_58._0_4_ - fVar22) / fVar34) * 0.99999976 * auVar20._0_4_))
        ;
        auVar24 = vroundss_avx(auVar24,auVar24,10);
        auVar24 = vminss_avx(auVar24,auVar20);
        local_98->count1[0] = local_98->count1[0] + (long)((int)auVar24._0_4_ - (int)auVar18._0_4_);
        auVar30 = ZEXT1664(local_48);
        end = local_a0;
        prims = local_a8;
        fVar34 = (float)local_68._0_4_;
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }